

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# period.cc
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  ostream *poVar2;
  datetime d;
  accessor<3600UL> local_228;
  accessor<3600UL> everyhour;
  iterator i;
  period period;
  datetime n;
  
  setlocale(6,"");
  asap::now();
  asap::now();
  period.begin_.when.tm_sec = 0;
  period.begin_.when.tm_min = 0x3ff00000;
  asap::datetime::operator+=(&n,(days *)&period);
  n.when.tm_hour = 0;
  mktime((tm *)&n);
  n.when.tm_min = 0;
  mktime((tm *)&n);
  n.when.tm_sec = 0;
  mktime((tm *)&n);
  period.begin_.when.tm_sec = i.now.when.tm_sec;
  period.begin_.when.tm_min = i.now.when.tm_min;
  period.begin_.when.tm_hour = i.now.when.tm_hour;
  period.begin_.when.tm_mday = i.now.when.tm_mday;
  period.begin_.when.tm_mon = i.now.when.tm_mon;
  period.begin_.when.tm_year = i.now.when.tm_year;
  period.begin_.when.tm_wday = i.now.when.tm_wday;
  period.begin_.when.tm_yday = i.now.when.tm_yday;
  period.begin_.when.tm_isdst = i.now.when.tm_isdst;
  period.begin_.when._36_4_ = i.now.when._36_4_;
  period.begin_.when.tm_gmtoff = i.now.when.tm_gmtoff;
  period.begin_.when.tm_zone = i.now.when.tm_zone;
  period.end_.when.tm_min = n.when.tm_min;
  period.end_.when.tm_sec = n.when.tm_sec;
  period.end_.when.tm_mday = n.when.tm_mday;
  period.end_.when.tm_hour = n.when.tm_hour;
  period.end_.when.tm_mon = n.when.tm_mon;
  period.end_.when.tm_year = n.when.tm_year;
  period.end_.when.tm_wday = n.when.tm_wday;
  period.end_.when.tm_yday = n.when.tm_yday;
  period.end_.when.tm_isdst = n.when.tm_isdst;
  period.end_.when._36_4_ = n.when._36_4_;
  period.end_.when.tm_gmtoff = n.when.tm_gmtoff;
  period.end_.when.tm_zone = n.when.tm_zone;
  everyhour.step.value = 1.0;
  everyhour.range = &period;
  poVar2 = std::operator<<((ostream *)&std::cout,"every hour until tomorrow:");
  std::endl<char,std::char_traits<char>>(poVar2);
  asap::detail::accessor<3600UL>::begin(&i,&everyhour);
  while( true ) {
    asap::detail::accessor<3600UL>::end((iterator *)&n,&everyhour);
    bVar1 = asap::detail::accessor<3600UL>::iterator::operator!=(&i,(iterator *)&n);
    if (!bVar1) break;
    poVar2 = std::operator<<((ostream *)&std::cout,"* ");
    asap::operator<<((basic_ostream<char,_std::char_traits<char>_> *)poVar2,&i.now);
    std::endl<char,std::char_traits<char>>(poVar2);
    asap::detail::accessor<3600UL>::iterator::operator++(&n,&i,0);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar2 = std::operator<<((ostream *)&std::cout,"every 3 hours until tomorrow:");
  std::endl<char,std::char_traits<char>>(poVar2);
  local_228.range = &period;
  local_228.step.value = 3.0;
  asap::detail::accessor<3600UL>::begin(&i,&local_228);
  asap::detail::accessor<3600UL>::end((iterator *)&n,&local_228);
  while( true ) {
    bVar1 = asap::detail::accessor<3600UL>::iterator::operator!=(&i,(iterator *)&n);
    if (!bVar1) break;
    d.when.tm_zone = i.now.when.tm_zone;
    d.when.tm_isdst = i.now.when.tm_isdst;
    d.when._36_4_ = i.now.when._36_4_;
    d.when.tm_gmtoff = i.now.when.tm_gmtoff;
    d.when.tm_mon = i.now.when.tm_mon;
    d.when.tm_year = i.now.when.tm_year;
    d.when.tm_wday = i.now.when.tm_wday;
    d.when.tm_yday = i.now.when.tm_yday;
    d.when.tm_sec = i.now.when.tm_sec;
    d.when.tm_min = i.now.when.tm_min;
    d.when.tm_hour = i.now.when.tm_hour;
    d.when.tm_mday = i.now.when.tm_mday;
    poVar2 = std::operator<<((ostream *)&std::cout,"* ");
    asap::operator<<((basic_ostream<char,_std::char_traits<char>_> *)poVar2,&d);
    std::endl<char,std::char_traits<char>>(poVar2);
    asap::detail::accessor<3600UL>::iterator::operator++(&i);
  }
  return 0;
}

Assistant:

int main(int argc, char * argv[]) {
  /* Setting locale helps with local time format. It is not required. */
  setlocale(LC_ALL, "");

  /* Creates a period, from now until tomorrow. */
  auto period = asap::now().until(asap::tomorrow());

  /* Iterates from now until tomorrow, by every hour, using oldschool iterators.
   * Be aware that tomorrow happens to be next day *exactly* at midnight, which means
   * unless asap::now() is exactly at 0 minutes and 0 seconds, the next day will
   * never be printed. */
  auto everyhour = period.every(asap::hours(1));
  std::cout << "every hour until tomorrow:" << std::endl;
  for (auto i = everyhour.begin(); i != everyhour.end(); i++) {
    std::cout << "* " << *i << std::endl;
  }
  std::cout << std::endl;

  /* you can also use the newschool for :) */
  std::cout << "every 3 hours until tomorrow:" << std::endl;
  for (auto d: period.every(asap::hour(3))) {
    std::cout << "* " << d << std::endl;
  }

  return 0;
}